

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O3

iterator __thiscall
ctemplate::
small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::find(small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
       *this,key_type *key)

{
  anon_union_64_3_1f8f2db0_for_small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
  *paVar1;
  _Base_ptr p_Var2;
  ulong uVar3;
  _Base_ptr p_Var4;
  ulong uVar5;
  iterator iVar6;
  iterator iVar7;
  
  uVar3 = (ulong)(uint)this->size_;
  if (this->size_ < 0) {
    p_Var2 = *(_Base_ptr *)((long)&this->field_2 + 0x18);
    iVar6._M_node = (_Base_ptr)((long)&this->field_2 + 0x10);
    if (p_Var2 != (_Base_ptr)0x0) {
      uVar3 = *key;
      p_Var4 = iVar6._M_node;
      do {
        if (*(ulong *)(p_Var2 + 1) >= uVar3) {
          p_Var4 = p_Var2;
        }
        p_Var2 = (&p_Var2->_M_left)[*(ulong *)(p_Var2 + 1) < uVar3];
      } while (p_Var2 != (_Base_ptr)0x0);
      if ((p_Var4 != iVar6._M_node) && (*(ulong *)(p_Var4 + 1) <= uVar3)) {
        iVar6._M_node = p_Var4;
      }
    }
    paVar1 = (anon_union_64_3_1f8f2db0_for_small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
              *)0x0;
  }
  else {
    if (uVar3 == 0) {
      uVar3 = 0;
    }
    else {
      paVar1 = &this->field_2;
      uVar5 = uVar3;
      do {
        if (*(key_type *)paVar1 == *key) goto LAB_0012a19d;
        paVar1 = (anon_union_64_3_1f8f2db0_for_small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
                  *)((long)paVar1 + 0x10);
        uVar5 = uVar5 - 1;
      } while (uVar5 != 0);
    }
    paVar1 = (anon_union_64_3_1f8f2db0_for_small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
              *)((long)&this->field_2 + uVar3 * 0x10);
LAB_0012a19d:
    iVar6._M_node = (_Base_ptr)0x0;
  }
  iVar7.hash_iter_._M_node = iVar6._M_node;
  iVar7.array_iter_ =
       (ManualConstructor<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>_>
        *)paVar1;
  return iVar7;
}

Assistant:

iterator find(const key_type& key) {
    key_equal compare;
    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, key)) {
          return iterator(array_ + i);
        }
      }
      return iterator(array_ + size_);
    } else {
      return iterator(map()->find(key));
    }
  }